

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTestCFile.c
# Opt level: O1

void all_mock_support_c_calls(void)

{
  _func_MockActualCall_c_ptr_char_ptr_int *p_Var1;
  _func_MockActualCall_c_ptr_char_ptr_char_ptr *p_Var2;
  _func_MockActualCall_c_ptr_char_ptr_double *p_Var3;
  _func_MockActualCall_c_ptr_char_ptr_void_ptr *p_Var4;
  _func_MockActualCall_c_ptr_char_ptr__func_void_ptr *p_Var5;
  MockSupport_c *pMVar6;
  MockExpectedCall_c *pMVar7;
  long lVar8;
  MockActualCall_c *pMVar9;
  MockValue_c MVar10;
  
  pMVar6 = mock_c();
  (*pMVar6->strictOrder)();
  pMVar6 = mock_c();
  (*pMVar6->expectOneCall)("boo");
  pMVar6 = mock_c();
  (*pMVar6->expectNoCall)("bla");
  pMVar6 = mock_c();
  (*pMVar6->expectNCalls)(1,"foo");
  pMVar6 = mock_c();
  (*pMVar6->actualCall)("boo");
  pMVar6 = mock_c();
  (*pMVar6->actualCall)("foo");
  pMVar6 = mock_c();
  (*pMVar6->checkExpectations)();
  pMVar6 = mock_c();
  pMVar7 = (*pMVar6->expectOneCall)("boo");
  pMVar7 = (*pMVar7->withIntParameters)("integer",1);
  pMVar7 = (*pMVar7->withBoolParameters)("bool",1);
  pMVar7 = (*pMVar7->withUnsignedIntParameters)("unsigned",1);
  pMVar7 = (*pMVar7->withLongIntParameters)("long int",-1);
  pMVar7 = (*pMVar7->withUnsignedLongIntParameters)("unsigned long int",1);
  pMVar7 = (*pMVar7->withLongLongIntParameters)("long long int",-1);
  pMVar7 = (*pMVar7->withUnsignedLongLongIntParameters)("unsigned long long int",1);
  pMVar7 = (*pMVar7->withDoubleParameters)("double",1.0);
  lVar8 = (*pMVar7->withDoubleParametersAndTolerance)(0x3ff0000000000000,0,"doubleWithTolerance");
  lVar8 = (**(code **)(lVar8 + 0x48))("string","string");
  lVar8 = (**(code **)(lVar8 + 0x50))("pointer",1);
  lVar8 = (**(code **)(lVar8 + 0x58))("constpointer",1);
  lVar8 = (**(code **)(lVar8 + 0x60))("functionpointer",1);
  lVar8 = (**(code **)(lVar8 + 0x68))("name",1,0);
  (**(code **)(lVar8 + 0x90))();
  pMVar6 = mock_c();
  pMVar9 = (*pMVar6->actualCall)("boo");
  pMVar9 = (*pMVar9->withIntParameters)("integer",1);
  pMVar9 = (*pMVar9->withBoolParameters)("bool",1);
  pMVar9 = (*pMVar9->withUnsignedIntParameters)("unsigned",1);
  pMVar9 = (*pMVar9->withLongIntParameters)("long int",-1);
  pMVar9 = (*pMVar9->withUnsignedLongIntParameters)("unsigned long int",1);
  pMVar9 = (*pMVar9->withLongLongIntParameters)("long long int",-1);
  pMVar9 = (*pMVar9->withUnsignedLongLongIntParameters)("unsigned long long int",1);
  pMVar9 = (*pMVar9->withDoubleParameters)("double",1.0);
  lVar8 = (*pMVar9->withDoubleParameters)("doubleWithTolerance");
  lVar8 = (**(code **)(lVar8 + 0x40))("string","string");
  lVar8 = (**(code **)(lVar8 + 0x48))("pointer",1);
  lVar8 = (**(code **)(lVar8 + 0x50))("constpointer",1);
  lVar8 = (**(code **)(lVar8 + 0x58))("functionpointer",1);
  lVar8 = (**(code **)(lVar8 + 0x60))("name",1,0);
  (**(code **)(lVar8 + 0x80))();
  pMVar6 = mock_c();
  (*pMVar6->disable)();
  pMVar6 = mock_c();
  pMVar7 = (*pMVar6->expectOneCall)("boo");
  pMVar7 = (*pMVar7->withParameterOfType)("type","name",(void *)0x1);
  pMVar7 = (*pMVar7->withOutputParameterReturning)("name",(void *)0x1,0);
  (*pMVar7->withOutputParameterOfTypeReturning)("type","name",(void *)0x1);
  pMVar6 = mock_c();
  pMVar9 = (*pMVar6->actualCall)("boo");
  pMVar9 = (*pMVar9->withParameterOfType)("type","name",(void *)0x1);
  pMVar9 = (*pMVar9->withOutputParameter)("name",(void *)0x1);
  (*pMVar9->withOutputParameterOfType)("type","name",(void *)0x1);
  pMVar6 = mock_c();
  (*pMVar6->enable)();
  pMVar6 = mock_c();
  (*pMVar6->clear)();
  pMVar6 = mock_c();
  (*pMVar6->installComparator)("typeName",typeNameIsEqual,typeNameValueToString);
  pMVar6 = mock_c();
  pMVar7 = (*pMVar6->expectOneCall)("boo");
  (*pMVar7->withParameterOfType)("typeName","name",(void *)0x1);
  pMVar6 = mock_c();
  pMVar9 = (*pMVar6->actualCall)("boo");
  (*pMVar9->withParameterOfType)("typeName","name",(void *)0x1);
  pMVar6 = mock_c();
  (*pMVar6->clear)();
  pMVar6 = mock_c();
  (*pMVar6->removeAllComparatorsAndCopiers)();
  pMVar6 = mock_c();
  pMVar7 = (*pMVar6->expectOneCall)("boo");
  (*pMVar7->andReturnBoolValue)(1);
  pMVar6 = mock_c();
  pMVar9 = (*pMVar6->actualCall)("boo");
  (*pMVar9->boolReturnValue)();
  pMVar6 = mock_c();
  (*pMVar6->boolReturnValue)();
  pMVar6 = mock_c();
  pMVar7 = (*pMVar6->expectOneCall)("boo");
  (*pMVar7->andReturnIntValue)(-10);
  pMVar6 = mock_c();
  pMVar9 = (*pMVar6->actualCall)("boo");
  (*pMVar9->intReturnValue)();
  pMVar6 = mock_c();
  (*pMVar6->intReturnValue)();
  pMVar6 = mock_c();
  (*pMVar6->returnValue)();
  pMVar6 = mock_c();
  pMVar7 = (*pMVar6->expectOneCall)("boo2");
  (*pMVar7->andReturnUnsignedIntValue)(1);
  pMVar6 = mock_c();
  pMVar9 = (*pMVar6->actualCall)("boo2");
  (*pMVar9->unsignedIntReturnValue)();
  pMVar6 = mock_c();
  (*pMVar6->unsignedIntReturnValue)();
  pMVar6 = mock_c();
  pMVar7 = (*pMVar6->expectOneCall)("boo3");
  (*pMVar7->andReturnLongIntValue)(1);
  pMVar6 = mock_c();
  pMVar9 = (*pMVar6->actualCall)("boo3");
  (*pMVar9->longIntReturnValue)();
  pMVar6 = mock_c();
  (*pMVar6->longIntReturnValue)();
  pMVar6 = mock_c();
  pMVar7 = (*pMVar6->expectOneCall)("boo3");
  (*pMVar7->andReturnUnsignedLongIntValue)(1);
  pMVar6 = mock_c();
  pMVar9 = (*pMVar6->actualCall)("boo3");
  (*pMVar9->unsignedLongIntReturnValue)();
  pMVar6 = mock_c();
  (*pMVar6->unsignedLongIntReturnValue)();
  pMVar6 = mock_c();
  pMVar7 = (*pMVar6->expectOneCall)("mgrgrgr1");
  (*pMVar7->andReturnLongLongIntValue)(1);
  pMVar6 = mock_c();
  pMVar9 = (*pMVar6->actualCall)("mgrgrgr1");
  (*pMVar9->longLongIntReturnValue)();
  pMVar6 = mock_c();
  (*pMVar6->longLongIntReturnValue)();
  pMVar6 = mock_c();
  pMVar7 = (*pMVar6->expectOneCall)("mgrgrgr2");
  (*pMVar7->andReturnUnsignedLongLongIntValue)(1);
  pMVar6 = mock_c();
  pMVar9 = (*pMVar6->actualCall)("mgrgrgr2");
  (*pMVar9->unsignedLongLongIntReturnValue)();
  pMVar6 = mock_c();
  (*pMVar6->unsignedLongLongIntReturnValue)();
  pMVar6 = mock_c();
  pMVar7 = (*pMVar6->expectOneCall)("boo4");
  (*pMVar7->andReturnDoubleValue)(1.0);
  pMVar6 = mock_c();
  pMVar9 = (*pMVar6->actualCall)("boo4");
  (*pMVar9->doubleReturnValue)();
  pMVar6 = mock_c();
  (*pMVar6->doubleReturnValue)();
  pMVar6 = mock_c();
  pMVar7 = (*pMVar6->expectOneCall)("boo5");
  (*pMVar7->andReturnStringValue)("hello world");
  pMVar6 = mock_c();
  pMVar9 = (*pMVar6->actualCall)("boo5");
  (*pMVar9->stringReturnValue)();
  pMVar6 = mock_c();
  (*pMVar6->stringReturnValue)();
  pMVar6 = mock_c();
  pMVar7 = (*pMVar6->expectOneCall)("boo6");
  (*pMVar7->andReturnPointerValue)((void *)0xa);
  pMVar6 = mock_c();
  pMVar9 = (*pMVar6->actualCall)("boo6");
  (*pMVar9->pointerReturnValue)();
  pMVar6 = mock_c();
  (*pMVar6->pointerReturnValue)();
  pMVar6 = mock_c();
  pMVar7 = (*pMVar6->expectOneCall)("boo7");
  (*pMVar7->andReturnConstPointerValue)((void *)0xa);
  pMVar6 = mock_c();
  pMVar9 = (*pMVar6->actualCall)("boo7");
  (*pMVar9->constPointerReturnValue)();
  pMVar6 = mock_c();
  (*pMVar6->constPointerReturnValue)();
  pMVar6 = mock_c();
  pMVar7 = (*pMVar6->expectOneCall)("boo8");
  (*pMVar7->andReturnFunctionPointerValue)((_func_void *)0xa);
  pMVar6 = mock_c();
  pMVar9 = (*pMVar6->actualCall)("boo8");
  (*pMVar9->functionPointerReturnValue)();
  pMVar6 = mock_c();
  (*pMVar6->functionPointerReturnValue)();
  pMVar6 = mock_c();
  (*pMVar6->setBoolData)("bool",1);
  pMVar6 = mock_c();
  pMVar7 = (*pMVar6->expectOneCall)("bla");
  (*pMVar7->withBoolParameters)("bool",1);
  pMVar6 = mock_c();
  pMVar9 = (*pMVar6->actualCall)("bla");
  p_Var1 = pMVar9->withBoolParameters;
  pMVar6 = mock_c();
  MVar10 = (*pMVar6->getData)("bool");
  (*p_Var1)("bool",MVar10.value._0_4_);
  pMVar6 = mock_c();
  (*pMVar6->setIntData)("int",5);
  pMVar6 = mock_c();
  pMVar7 = (*pMVar6->expectOneCall)("bla");
  (*pMVar7->withIntParameters)("int",5);
  pMVar6 = mock_c();
  pMVar9 = (*pMVar6->actualCall)("bla");
  p_Var1 = pMVar9->withIntParameters;
  pMVar6 = mock_c();
  MVar10 = (*pMVar6->getData)("int");
  (*p_Var1)("int",MVar10.value._0_4_);
  pMVar6 = mock_c();
  (*pMVar6->setStringData)("string","lol");
  pMVar6 = mock_c();
  pMVar7 = (*pMVar6->expectOneCall)("bla");
  (*pMVar7->withStringParameters)("str","lol");
  pMVar6 = mock_c();
  pMVar9 = (*pMVar6->actualCall)("bla");
  p_Var2 = pMVar9->withStringParameters;
  pMVar6 = mock_c();
  MVar10 = (*pMVar6->getData)("string");
  (*p_Var2)("str",MVar10.value.stringValue);
  pMVar6 = mock_c();
  (*pMVar6->setDoubleData)("double",0.001);
  pMVar6 = mock_c();
  pMVar7 = (*pMVar6->expectOneCall)("bla");
  (*pMVar7->withDoubleParameters)("double",0.001);
  pMVar6 = mock_c();
  pMVar9 = (*pMVar6->actualCall)("bla");
  p_Var3 = pMVar9->withDoubleParameters;
  pMVar6 = mock_c();
  MVar10 = (*pMVar6->getData)("double");
  (*p_Var3)("double",MVar10.value.doubleValue);
  pMVar6 = mock_c();
  (*pMVar6->setPointerData)("ptr",(void *)0x1);
  pMVar6 = mock_c();
  pMVar7 = (*pMVar6->expectOneCall)("bla");
  (*pMVar7->withPointerParameters)("ptr",(void *)0x1);
  pMVar6 = mock_c();
  pMVar9 = (*pMVar6->actualCall)("bla");
  p_Var4 = pMVar9->withPointerParameters;
  pMVar6 = mock_c();
  MVar10 = (*pMVar6->getData)("ptr");
  (*p_Var4)("ptr",MVar10.value.pointerValue);
  pMVar6 = mock_c();
  (*pMVar6->setConstPointerData)("cptr",(void *)0x1);
  pMVar6 = mock_c();
  pMVar7 = (*pMVar6->expectOneCall)("bla");
  (*pMVar7->withConstPointerParameters)("cptr",(void *)0x1);
  pMVar6 = mock_c();
  pMVar9 = (*pMVar6->actualCall)("bla");
  p_Var4 = pMVar9->withConstPointerParameters;
  pMVar6 = mock_c();
  MVar10 = (*pMVar6->getData)("ptr");
  (*p_Var4)("cptr",MVar10.value.pointerValue);
  pMVar6 = mock_c();
  (*pMVar6->setFunctionPointerData)("ptr",(_func_void *)0x1);
  pMVar6 = mock_c();
  pMVar7 = (*pMVar6->expectOneCall)("bla");
  (*pMVar7->withFunctionPointerParameters)("ptr",(_func_void *)0x1);
  pMVar6 = mock_c();
  pMVar9 = (*pMVar6->actualCall)("bla");
  p_Var5 = pMVar9->withFunctionPointerParameters;
  pMVar6 = mock_c();
  MVar10 = (*pMVar6->getData)("ptr");
  (*p_Var5)("ptr",MVar10.value.functionPointerValue);
  pMVar6 = mock_c();
  (*pMVar6->clear)();
  pMVar6 = mock_c();
  (*pMVar6->hasReturnValue)();
  pMVar6 = mock_c();
  (*pMVar6->returnBoolValueOrDefault)(1);
  pMVar6 = mock_c();
  (*pMVar6->returnIntValueOrDefault)(-1);
  pMVar6 = mock_c();
  (*pMVar6->returnUnsignedIntValueOrDefault)(1);
  pMVar6 = mock_c();
  (*pMVar6->returnLongIntValueOrDefault)(-1);
  pMVar6 = mock_c();
  (*pMVar6->returnUnsignedLongIntValueOrDefault)(1);
  pMVar6 = mock_c();
  (*pMVar6->returnLongLongIntValueOrDefault)(-1);
  pMVar6 = mock_c();
  (*pMVar6->returnUnsignedLongLongIntValueOrDefault)(1);
  pMVar6 = mock_c();
  (*pMVar6->returnStringValueOrDefault)("");
  pMVar6 = mock_c();
  (*pMVar6->returnDoubleValueOrDefault)(0.01);
  pMVar6 = mock_c();
  (*pMVar6->returnPointerValueOrDefault)((void *)0x0);
  pMVar6 = mock_c();
  (*pMVar6->returnConstPointerValueOrDefault)((void *)0x0);
  pMVar6 = mock_c();
  (*pMVar6->returnFunctionPointerValueOrDefault)((_func_void *)0x0);
  pMVar6 = mock_c();
  (*pMVar6->disable)();
  pMVar6 = mock_c();
  (*pMVar6->actualCall)("disabled");
  pMVar6 = mock_c();
  (*pMVar6->enable)();
  pMVar6 = mock_c();
  (*pMVar6->checkExpectations)();
  pMVar6 = mock_c();
  (*pMVar6->setIntData)("bla1",-2);
  pMVar6 = mock_c();
  (*pMVar6->setUnsignedIntData)("bla2",2);
  pMVar6 = mock_c();
  (*pMVar6->setDoubleData)("bla3",0.035);
  pMVar6 = mock_c();
  (*pMVar6->setStringData)("bla4","abc");
  pMVar6 = mock_c();
  (*pMVar6->setPointerData)("bla",(void *)0x2);
  pMVar6 = mock_c();
  (*pMVar6->setConstPointerData)("bla",(void *)0x2);
  pMVar6 = mock_c();
  (*pMVar6->setFunctionPointerData)("bla",(_func_void *)0x2);
  pMVar6 = mock_c();
  (*pMVar6->setDataObject)("bla","type",(void *)0x2);
  pMVar6 = mock_c();
  (*pMVar6->getData)("bla");
  pMVar6 = mock_scope_c("scope");
  (*pMVar6->expectOneCall)("boo");
  pMVar6 = mock_scope_c("other");
  (*pMVar6->expectedCallsLeft)();
  pMVar6 = mock_scope_c("scope");
  (*pMVar6->expectedCallsLeft)();
  pMVar6 = mock_scope_c("scope");
  (*pMVar6->actualCall)("boo");
  return;
}

Assistant:

void all_mock_support_c_calls(void)
{
    mock_c()->strictOrder();
    mock_c()->expectOneCall("boo");
    mock_c()->expectNoCall("bla");
    mock_c()->expectNCalls(1, "foo");
    mock_c()->actualCall("boo");
    mock_c()->actualCall("foo");
    mock_c()->checkExpectations();

    mock_c()->expectOneCall("boo")->withIntParameters("integer", 1)->
            withBoolParameters("bool", 1)->
            withUnsignedIntParameters("unsigned", 1)->
            withLongIntParameters("long int", (long int) -1)->
            withUnsignedLongIntParameters("unsigned long int", (unsigned long int) 1)->
#if CPPUTEST_USE_LONG_LONG
            withLongLongIntParameters("long long int", (long long int) -1)->
            withUnsignedLongLongIntParameters("unsigned long long int", (unsigned long long int) 1)->
#endif

            withDoubleParameters("double", 1.0)->
            withDoubleParametersAndTolerance("doubleWithTolerance", 1.0, 1.0)->
            withStringParameters("string", "string")->
            withPointerParameters("pointer", (void*) 1)->
            withConstPointerParameters("constpointer", (const void*) 1)->
            withFunctionPointerParameters("functionpointer", (void(*)(void)) 1)->
            withMemoryBufferParameter("name", (void*) 1, 0UL)->
            ignoreOtherParameters();

    mock_c()->actualCall("boo")->withIntParameters("integer", 1)->
            withBoolParameters("bool", 1)->
            withUnsignedIntParameters("unsigned", 1)->
            withLongIntParameters("long int", (long int) -1)->
            withUnsignedLongIntParameters("unsigned long int", (unsigned long int) 1)->
#if CPPUTEST_USE_LONG_LONG
            withLongLongIntParameters("long long int", (long long int) -1)->
            withUnsignedLongLongIntParameters("unsigned long long int", (unsigned long long int) 1)->
#endif
            withDoubleParameters("double", 1.0)->
            withDoubleParameters("doubleWithTolerance", 0.0 )->
            withStringParameters("string", "string")->
            withPointerParameters("pointer", (void*) 1)->
            withConstPointerParameters("constpointer", (const void*) 1)->
            withFunctionPointerParameters("functionpointer", (void(*)(void)) 1)->
            withMemoryBufferParameter("name", (void*) 1, 0UL)->
            hasReturnValue();

    mock_c()->disable();
    mock_c()->expectOneCall("boo")->withParameterOfType("type", "name", (void*) 1)->
            withOutputParameterReturning("name", (void*)1, 0UL)->
            withOutputParameterOfTypeReturning("type", "name", (void*)1);
    mock_c()->actualCall("boo")->withParameterOfType("type", "name", (void*) 1)->
            withOutputParameter("name", (void*)1)->
            withOutputParameterOfType("type", "name", (void*)1);
    mock_c()->enable();

    mock_c()->clear();

    mock_c()->installComparator("typeName", typeNameIsEqual, typeNameValueToString);
    mock_c()->expectOneCall("boo")->withParameterOfType("typeName", "name", (void*) 1);
    mock_c()->actualCall("boo")->withParameterOfType("typeName", "name", (void*) 1);
    mock_c()->clear();
    mock_c()->removeAllComparatorsAndCopiers();

    mock_c()->expectOneCall("boo")->andReturnBoolValue(1);
    mock_c()->actualCall("boo")->boolReturnValue();
    mock_c()->boolReturnValue();

    mock_c()->expectOneCall("boo")->andReturnIntValue(-10);
    mock_c()->actualCall("boo")->intReturnValue();
    mock_c()->intReturnValue();
    mock_c()->returnValue();

    mock_c()->expectOneCall("boo2")->andReturnUnsignedIntValue(1);
    mock_c()->actualCall("boo2")->unsignedIntReturnValue();
    mock_c()->unsignedIntReturnValue();

    mock_c()->expectOneCall("boo3")->andReturnLongIntValue(1);
    mock_c()->actualCall("boo3")->longIntReturnValue();
    mock_c()->longIntReturnValue();

    mock_c()->expectOneCall("boo3")->andReturnUnsignedLongIntValue(1);
    mock_c()->actualCall("boo3")->unsignedLongIntReturnValue();
    mock_c()->unsignedLongIntReturnValue();

#if CPPUTEST_USE_LONG_LONG
    mock_c()->expectOneCall("mgrgrgr1")->andReturnLongLongIntValue(1);
    mock_c()->actualCall("mgrgrgr1")->longLongIntReturnValue();
    mock_c()->longLongIntReturnValue();

    mock_c()->expectOneCall("mgrgrgr2")->andReturnUnsignedLongLongIntValue(1);
    mock_c()->actualCall("mgrgrgr2")->unsignedLongLongIntReturnValue();
    mock_c()->unsignedLongLongIntReturnValue();
#endif

    mock_c()->expectOneCall("boo4")->andReturnDoubleValue(1.0);
    mock_c()->actualCall("boo4")->doubleReturnValue();
    mock_c()->doubleReturnValue();

    mock_c()->expectOneCall("boo5")->andReturnStringValue("hello world");
    mock_c()->actualCall("boo5")->stringReturnValue();
    mock_c()->stringReturnValue();

    mock_c()->expectOneCall("boo6")->andReturnPointerValue((void*) 10);
    mock_c()->actualCall("boo6")->pointerReturnValue();
    mock_c()->pointerReturnValue();

    mock_c()->expectOneCall("boo7")->andReturnConstPointerValue((void*) 10);
    mock_c()->actualCall("boo7")->constPointerReturnValue();
    mock_c()->constPointerReturnValue();

    mock_c()->expectOneCall("boo8")->andReturnFunctionPointerValue((void(*)(void)) 10);
    mock_c()->actualCall("boo8")->functionPointerReturnValue();
    mock_c()->functionPointerReturnValue();

    mock_c()->setBoolData("bool", 1);
    mock_c()->expectOneCall("bla")->withBoolParameters("bool", 1);
    mock_c()->actualCall("bla")->withBoolParameters("bool", mock_c()->getData("bool").value.boolValue);

    mock_c()->setIntData("int", 5);
    mock_c()->expectOneCall("bla")->withIntParameters("int", 5);
    mock_c()->actualCall("bla")->withIntParameters("int", mock_c()->getData("int").value.intValue);

    mock_c()->setStringData("string", "lol");
    mock_c()->expectOneCall("bla")->withStringParameters("str", "lol");
    mock_c()->actualCall("bla")->withStringParameters("str", mock_c()->getData("string").value.stringValue);

    mock_c()->setDoubleData("double", 0.001);
    mock_c()->expectOneCall("bla")->withDoubleParameters("double", 0.001);
    mock_c()->actualCall("bla")->withDoubleParameters("double", mock_c()->getData("double").value.doubleValue);

    mock_c()->setPointerData("ptr", (void*)1);
    mock_c()->expectOneCall("bla")->withPointerParameters("ptr", (void*)1);
    mock_c()->actualCall("bla")->withPointerParameters("ptr", mock_c()->getData("ptr").value.pointerValue);

    mock_c()->setConstPointerData("cptr", (const void*)1);
    mock_c()->expectOneCall("bla")->withConstPointerParameters("cptr", (const void*)1);
    mock_c()->actualCall("bla")->withConstPointerParameters("cptr", mock_c()->getData("ptr").value.constPointerValue);

    mock_c()->setFunctionPointerData("ptr", (void(*)(void))1);
    mock_c()->expectOneCall("bla")->withFunctionPointerParameters("ptr", (void(*)(void))1);
    mock_c()->actualCall("bla")->withFunctionPointerParameters("ptr", mock_c()->getData("ptr").value.functionPointerValue);

    mock_c()->clear();

    mock_c()->hasReturnValue();
    mock_c()->returnBoolValueOrDefault(1);
    mock_c()->returnIntValueOrDefault(-1);
    mock_c()->returnUnsignedIntValueOrDefault(1);
    mock_c()->returnLongIntValueOrDefault(-1L);
    mock_c()->returnUnsignedLongIntValueOrDefault(1L);
#if CPPUTEST_USE_LONG_LONG
    mock_c()->returnLongLongIntValueOrDefault(-1LL);
    mock_c()->returnUnsignedLongLongIntValueOrDefault(1ULL);
#endif
    mock_c()->returnStringValueOrDefault("");
    mock_c()->returnDoubleValueOrDefault(0.01);
    mock_c()->returnPointerValueOrDefault(0);
    mock_c()->returnConstPointerValueOrDefault(0);
    mock_c()->returnFunctionPointerValueOrDefault(0);

    mock_c()->disable();
    mock_c()->actualCall("disabled");
    mock_c()->enable();
    mock_c()->checkExpectations();

    mock_c()->setIntData("bla1", -2);
    mock_c()->setUnsignedIntData("bla2", 2);
    mock_c()->setDoubleData("bla3", 0.035);
    mock_c()->setStringData("bla4", "abc");
    mock_c()->setPointerData("bla", (void*) 2);
    mock_c()->setConstPointerData("bla", (const void*) 2);
    mock_c()->setFunctionPointerData("bla", (void (*)(void)) 2);
    mock_c()->setDataObject("bla", "type", (void*) 2);
    mock_c()->getData("bla");

    mock_scope_c("scope")->expectOneCall("boo");
    mock_scope_c("other")->expectedCallsLeft();
    mock_scope_c("scope")->expectedCallsLeft();
    mock_scope_c("scope")->actualCall("boo");
}